

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uinvchar.cpp
# Opt level: O3

uint8_t * uprv_eastrncpy_63(uint8_t *dst,uint8_t *src,int32_t n)

{
  byte bVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  uint8_t uVar5;
  uint8_t *__s;
  byte *pbVar6;
  
  if (n == -1) {
    sVar3 = strlen((char *)src);
    n = (int)sVar3 + 1;
  }
  bVar1 = *src;
  __s = dst;
  if (0 < n && bVar1 != 0) {
    pbVar6 = src + 1;
    uVar4 = n;
    do {
      uVar5 = ""[bVar1];
      if (uVar5 == '\0') {
        uVar5 = 'o';
      }
      *__s = uVar5;
      __s = __s + 1;
      n = uVar4 - 1;
      bVar1 = *pbVar6;
    } while ((bVar1 != 0) && (pbVar6 = pbVar6 + 1, bVar2 = 1 < uVar4, uVar4 = n, bVar2));
  }
  if (0 < n) {
    memset(__s,0,(ulong)(uint)n);
  }
  return dst;
}

Assistant:

U_INTERNAL uint8_t* U_EXPORT2
uprv_eastrncpy(uint8_t *dst, const uint8_t *src, int32_t n)
{
  uint8_t *orig_dst = dst;

  if(n==-1) { 
    n = static_cast<int32_t>(uprv_strlen((const char*)src)+1); /* copy NUL */
  }
  /* copy non-null */
  while(*src && n>0) {
    char ch = ebcdicFromAscii[*(src++)];
    if(ch == 0) {
      ch = ebcdicFromAscii[0x3f]; /* questionmark (subchar) */
    }
    *(dst++) = ch;
    n--;
  }
  /* pad */
  while(n>0) {
    *(dst++) = 0;
    n--;
  }
  return orig_dst;
}